

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapper.c
# Opt level: O0

int Map_CommandReadLibrary(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  FILE *__stream_00;
  void *pvVar2;
  Mio_Library_t *pGenlib;
  Map_SuperLib_t *pLib_00;
  Map_SuperLib_t *p;
  char *pcVar3;
  uint local_68;
  int c;
  int fAlgorithm;
  int fVerbose;
  char *ExcludeFile;
  char *FileName;
  Abc_Ntk_t *pNet;
  Map_SuperLib_t *pLib;
  FILE *pErr;
  FILE *pOut;
  FILE *pFile;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Abc_FrameReadNtk(pAbc);
  Abc_FrameReadOut(pAbc);
  __stream = (FILE *)Abc_FrameReadErr(pAbc);
  c = 1;
  local_68 = 1;
  _fAlgorithm = (char *)0x0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"eovh"), iVar1 != -1) {
    switch(iVar1) {
    case 0x65:
      _fAlgorithm = argv[globalUtilOptind];
      if (_fAlgorithm == (char *)0x0) goto LAB_004a785c;
      globalUtilOptind = globalUtilOptind + 1;
      break;
    default:
      goto LAB_004a785c;
    case 0x68:
      goto LAB_004a785c;
    case 0x6f:
      local_68 = local_68 ^ 1;
      break;
    case 0x76:
      c = c ^ 1;
    }
  }
  if (argc == globalUtilOptind + 1) {
    pcVar3 = argv[globalUtilOptind];
    __stream_00 = (FILE *)Io_FileOpen(pcVar3,"open_path","r",0);
    if (__stream_00 == (FILE *)0x0) {
      fprintf(__stream,"Cannot open input file \"%s\". ",pcVar3);
      pcVar3 = Extra_FileGetSimilarName(pcVar3,".genlib",".lib",".gen",".g",(char *)0x0);
      if (pcVar3 != (char *)0x0) {
        fprintf(__stream,"Did you mean \"%s\"?",pcVar3);
      }
      fprintf(__stream,"\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      fclose(__stream_00);
      pvVar2 = Abc_FrameReadLibGen();
      if (pvVar2 == (void *)0x0) {
        fprintf(__stream,"Genlib library should be read in first..\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        pGenlib = (Mio_Library_t *)Abc_FrameReadLibGen();
        pLib_00 = Map_SuperLibCreate(pGenlib,(Vec_Str_t *)0x0,pcVar3,_fAlgorithm,local_68,c);
        if (pLib_00 == (Map_SuperLib_t *)0x0) {
          fprintf(__stream,"Reading supergate library has failed.\n");
          pAbc_local._4_4_ = 1;
        }
        else {
          p = (Map_SuperLib_t *)Abc_FrameReadLibSuper();
          Map_SuperLibFree(p);
          Abc_FrameSetLibSuper(pLib_00);
          pAbc_local._4_4_ = 0;
        }
      }
    }
  }
  else {
LAB_004a785c:
    fprintf(__stream,"\nusage: read_super [-ovh]\n");
    fprintf(__stream,"\t         read the supergate library from the file\n");
    fprintf(__stream,"\t-e file : file contains list of genlib gates to exclude\n");
    pcVar3 = "Sort old";
    if (local_68 != 0) {
      pcVar3 = "Sort new";
    }
    fprintf(__stream,"\t-o      : toggles the use of old file format [default = %s]\n",pcVar3 + 5);
    pcVar3 = "no";
    if (c != 0) {
      pcVar3 = "yes";
    }
    fprintf(__stream,"\t-v      : toggles enabling of verbose output [default = %s]\n",pcVar3);
    fprintf(__stream,"\t-h      : print the command usage\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Map_CommandReadLibrary( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pFile;
    FILE * pOut, * pErr;
    Map_SuperLib_t * pLib;
    Abc_Ntk_t * pNet;
    char * FileName, * ExcludeFile;
    int fVerbose;
    int fAlgorithm;
    int c;

    pNet = Abc_FrameReadNtk(pAbc);
    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    // set the defaults
    fVerbose = 1;
    fAlgorithm = 1;
    ExcludeFile = 0;
    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "eovh")) != EOF ) 
    {
        switch (c) 
        {
            case 'e':
                ExcludeFile = argv[globalUtilOptind];
                if ( ExcludeFile == 0 )
                    goto usage;
                globalUtilOptind++;
                break;
            case 'o':
                fAlgorithm ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }


    if ( argc != globalUtilOptind + 1 )
    {
        goto usage;
    }

    // get the input file name
    FileName = argv[globalUtilOptind];
    if ( (pFile = Io_FileOpen( FileName, "open_path", "r", 0 )) == NULL )
//    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        fprintf( pErr, "Cannot open input file \"%s\". ", FileName );
        if (( FileName = Extra_FileGetSimilarName( FileName, ".genlib", ".lib", ".gen", ".g", NULL )) )
            fprintf( pErr, "Did you mean \"%s\"?", FileName );
        fprintf( pErr, "\n" );
        return 1;
    }
    fclose( pFile );

    if ( Abc_FrameReadLibGen() == NULL )
    {
        fprintf( pErr, "Genlib library should be read in first..\n" );
        return 1;
    }

    // set the new network
    pLib = Map_SuperLibCreate( (Mio_Library_t *)Abc_FrameReadLibGen(), NULL, FileName, ExcludeFile, fAlgorithm, fVerbose );
    if ( pLib == NULL )
    {
        fprintf( pErr, "Reading supergate library has failed.\n" );
        return 1;
    }
    // replace the current library
//    Map_SuperLibFree( s_pSuperLib );
//    s_pSuperLib = pLib;
    Map_SuperLibFree( (Map_SuperLib_t *)Abc_FrameReadLibSuper() );
    Abc_FrameSetLibSuper( pLib );
    // replace the current genlib library
//    Mio_LibraryDelete( (Mio_Library_t *)Abc_FrameReadLibGen() );
//    Abc_FrameSetLibGen( (Mio_Library_t *)pLib->pGenlib );
    return 0;

usage:
    fprintf( pErr, "\nusage: read_super [-ovh]\n");
    fprintf( pErr, "\t         read the supergate library from the file\n" );  
    fprintf( pErr, "\t-e file : file contains list of genlib gates to exclude\n" );
    fprintf( pErr, "\t-o      : toggles the use of old file format [default = %s]\n", (fAlgorithm? "new" : "old") );
    fprintf( pErr, "\t-v      : toggles enabling of verbose output [default = %s]\n", (fVerbose? "yes" : "no") );
    fprintf( pErr, "\t-h      : print the command usage\n");
    return 1;       /* error exit */
}